

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

Result_Type
chaiscript::detail::
Cast_Helper_Inner<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_&>
::cast(Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  Result_Type pmVar2;
  undefined8 uVar3;
  bad_any_cast *in_RSI;
  void *p;
  type_info *in_stack_ffffffffffffffe8;
  
  Boxed_Value::get_type_info((Boxed_Value *)0x40db88);
  bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_RSI,in_stack_ffffffffffffffe8);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    exception::bad_any_cast::bad_any_cast(in_RSI);
    __cxa_throw(uVar3,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
  }
  Boxed_Value::get_const_ptr((Boxed_Value *)0x40dba7);
  pmVar2 = (Result_Type)throw_if_null<void_const>(in_RSI);
  return pmVar2;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            auto p = throw_if_null(ob.get_const_ptr());
            return *static_cast<const Result *>(p);
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }